

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCountFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlXPathObjectPtr value;
  int iVar2;
  int iVar3;
  double val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar3 = ctxt->valueNr;
    if ((long)iVar3 < 1) {
      iVar3 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        iVar2 = iVar3 + -1;
        ctxt->valueNr = iVar2;
        if (iVar3 == 1) {
          pxVar1 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar1 = ctxt->valueTab[(long)iVar3 + -2];
        }
        ctxt->value = pxVar1;
        pxVar1 = ctxt->valueTab[iVar2];
        ctxt->valueTab[iVar2] = (xmlXPathObjectPtr)0x0;
        val = 0.0;
        if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->nodesetval != (xmlNodeSetPtr)0x0)) {
          val = (double)pxVar1->nodesetval->nodeNr;
        }
        value = xmlXPathCacheNewFloat(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar1);
        return;
      }
      iVar3 = 0xb;
    }
  }
  else {
    iVar3 = 0xc;
  }
  xmlXPathErr(ctxt,iVar3);
  return;
}

Assistant:

void
xmlXPathCountFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur == NULL) || (cur->nodesetval == NULL))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0.0));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	    (double) cur->nodesetval->nodeNr));
    xmlXPathReleaseObject(ctxt->context, cur);
}